

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_service_client(t_dart_generator *this,t_service *tservice)

{
  bool bVar1;
  uint uVar2;
  t_service *ptVar3;
  ostream *poVar4;
  ulong uVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  string *psVar7;
  members_type *this_00;
  t_type *ptVar8;
  t_struct *this_01;
  reference pptVar9;
  char *pcVar10;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  allocator local_491;
  string local_490;
  string local_470;
  undefined1 local_450 [8];
  string result_field_name;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_420
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  string local_398;
  string local_378;
  undefined1 local_358 [8];
  string result_class;
  allocator local_311;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [8];
  string arg_field_name;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  const_iterator fld_iter;
  undefined1 local_270 [8];
  string argsname;
  t_struct *arg_struct;
  string local_240;
  string local_220;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_200;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1f8;
  t_function **local_1f0;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_1e8;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  allocator local_71;
  string local_70 [8];
  string extends_client;
  allocator local_39;
  undefined1 local_38 [8];
  string extends;
  t_service *tservice_local;
  t_dart_generator *this_local;
  
  extends.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends((t_service *)extends.field_2._8_8_);
    get_ttype_class_name_abi_cxx11_(&local_98,this,&ptVar3->super_t_type);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_name.field_2 + 8)," extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&class_name.field_2 + 8),"Client");
    std::__cxx11::string::operator=(local_70,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &(this->super_t_oop_generator).super_t_generator.service_name_,"Client");
  std::__cxx11::string::string
            ((string *)&local_138,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  get_file_name(&local_118,this,&local_138);
  std::__cxx11::string::string((string *)&local_158,(string *)local_f8);
  export_class_to_library(this,&local_118,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"class ");
  poVar4 = std::operator<<(poVar4,(string *)local_f8);
  poVar4 = std::operator<<(poVar4,local_70);
  poVar4 = std::operator<<(poVar4," implements ");
  std::operator<<(poVar4,(string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178," ",&local_179);
  scope_up(this,(ostream *)&this->f_service_,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,(string *)local_f8);
  std::operator<<(poVar4,"(TProtocol iprot, [TProtocol oprot = null])");
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    t_generator::indent_up((t_generator *)this);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,": super(iprot, oprot);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0," ",&local_1a1);
    scope_up(this,(ostream *)&this->f_service_,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"_iprot = iprot;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"_oprot = (oprot == null) ? iprot : oprot;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&::endl_abi_cxx11_);
    scope_down(this,(ostream *)&this->f_service_,
               (string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"TProtocol _iprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"TProtocol get iprot => _iprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"TProtocol _oprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"TProtocol get oprot => _oprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"int _seqid = 0;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"int get seqid => _seqid;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"int nextSeqid() => ++_seqid;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  }
  __x = t_service::get_functions((t_service *)extends.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_1e8);
  local_1f8._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_1f0,&local_1f8);
  local_1e8._M_current = local_1f0;
  while( true ) {
    local_200._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_1e8,&local_200);
    if (!bVar1) break;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    function_signature_abi_cxx11_(&local_220,this,*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)&local_220);
    std::operator<<(poVar4," async");
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240," ",(allocator *)((long)&arg_struct + 7));
    scope_up(this,(ostream *)&this->f_service_,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)((long)&arg_struct + 7));
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    argsname.field_2._8_8_ = t_function::get_arglist(*pptVar6);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string((string *)&fld_iter,(string *)psVar7);
    get_args_class_name((string *)local_270,this,(string *)&fld_iter);
    std::__cxx11::string::~string((string *)&fld_iter);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)&fields);
    this_00 = t_struct::get_members((t_struct *)argsname.field_2._8_8_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"oprot.writeMessageBegin(new TMessage(\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"\", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    bVar1 = t_function::is_oneway(*pptVar6);
    pcVar10 = "TMessageType.CALL";
    if (bVar1) {
      pcVar10 = "TMessageType.ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar10);
    poVar4 = std::operator<<(poVar4,", nextSeqid()));");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,(string *)local_270);
    poVar4 = std::operator<<(poVar4," args = new ");
    poVar4 = std::operator<<(poVar4,(string *)local_270);
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    fields = (vector<t_field_*,_std::allocator<t_field_*>_> *)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    while( true ) {
      arg_field_name.field_2._8_8_ =
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&fields,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&arg_field_name.field_2 + 8));
      if (!bVar1) break;
      pptVar9 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&fields);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
      std::__cxx11::string::string((string *)&local_2f0,(string *)psVar7);
      get_member_name((string *)local_2d0,this,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"args.");
      poVar4 = std::operator<<(poVar4,(string *)local_2d0);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,(string *)local_2d0);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_2d0);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&fields);
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"args.write(oprot);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"oprot.writeMessageEnd();");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"await oprot.transport.flush();");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_1e8);
    bVar1 = t_function::is_oneway(*pptVar6);
    if (!bVar1) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"TMessage msg = iprot.readMessageBegin();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      std::operator<<(poVar4,"if (msg.type == TMessageType.EXCEPTION)");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_310," ",&local_311);
      scope_up(this,(ostream *)&this->f_service_,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"TApplicationError error = TApplicationError.read(iprot);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"throw error;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string
                ((string *)(result_class.field_2._M_local_buf + 8),(string *)&endl2_abi_cxx11_);
      scope_down(this,(ostream *)&this->f_service_,(string *)((long)&result_class.field_2 + 8));
      std::__cxx11::string::~string((string *)(result_class.field_2._M_local_buf + 8));
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1e8);
      psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
      std::__cxx11::string::string((string *)&local_378,(string *)psVar7);
      get_result_class_name((string *)local_358,this,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,(string *)local_358);
      poVar4 = std::operator<<(poVar4," result = new ");
      poVar4 = std::operator<<(poVar4,(string *)local_358);
      poVar4 = std::operator<<(poVar4,"();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"result.read(iprot);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
      poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1e8);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"if (result.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b8,"success",&local_3b9);
        generate_isset_check(&local_398,this,&local_3b8);
        poVar4 = std::operator<<(poVar4,(string *)&local_398);
        std::operator<<(poVar4,")");
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e0," ",&local_3e1);
        scope_up(this,(ostream *)&this->f_service_,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"return result.success;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&xs,(string *)&endl2_abi_cxx11_);
        scope_down(this,(ostream *)&this->f_service_,(string *)&xs);
        std::__cxx11::string::~string((string *)&xs);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1e8);
      this_01 = t_function::get_xceptions(*pptVar6);
      x_iter._M_current = (t_field **)t_struct::get_members(this_01);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_420);
      local_420._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      while( true ) {
        result_field_name.field_2._8_8_ =
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_420,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)((long)&result_field_name.field_2 + 8));
        if (!bVar1) break;
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_420);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar9);
        std::__cxx11::string::string((string *)&local_470,(string *)psVar7);
        get_member_name((string *)local_450,this,&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"if (result.");
        poVar4 = std::operator<<(poVar4,(string *)local_450);
        std::operator<<(poVar4," != null)");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_490," ",&local_491);
        scope_up(this,(ostream *)&this->f_service_,&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator((allocator<char> *)&local_491);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"throw result.");
        poVar4 = std::operator<<(poVar4,(string *)local_450);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&local_4b8,(string *)&::endl_abi_cxx11_);
        scope_down(this,(ostream *)&this->f_service_,&local_4b8);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)local_450);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_420);
      }
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_1e8);
      ptVar8 = t_function::get_returntype(*pptVar6);
      uVar2 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,
                                 "throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \""
                                );
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_1e8);
        psVar7 = t_function::get_name_abi_cxx11_(*pptVar6);
        poVar4 = std::operator<<(poVar4,(string *)psVar7);
        poVar4 = std::operator<<(poVar4," failed: unknown result\");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"return;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)local_358);
    }
    std::__cxx11::string::string((string *)&local_4d8,(string *)&endl2_abi_cxx11_);
    scope_down(this,(ostream *)&this->f_service_,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)local_270);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_1e8);
  }
  std::__cxx11::string::string((string *)&local_4f8,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)&this->f_service_,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_dart_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_client = " extends " + extends + "Client";
  }

  string class_name = service_name_ + "Client";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_client
                     << " implements " << service_name_;
  scope_up(f_service_);
  f_service_ << endl;

  indent(f_service_) << class_name << "(TProtocol iprot, [TProtocol oprot = null])";

  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iprot, oprot);" << endl;
    indent_down();
  } else {
    scope_up(f_service_);
    indent(f_service_) << "_iprot = iprot;" << endl;
    indent(f_service_) << "_oprot = (oprot == null) ? iprot : oprot;" << endl;
    scope_down(f_service_);
  }
  f_service_ << endl;

  if (extends.empty()) {
    indent(f_service_) << "TProtocol _iprot;" << endl2;
    indent(f_service_) << "TProtocol get iprot => _iprot;" << endl2;
    indent(f_service_) << "TProtocol _oprot;" << endl2;
    indent(f_service_) << "TProtocol get oprot => _oprot;" << endl2;
    indent(f_service_) << "int _seqid = 0;" << endl2;
    indent(f_service_) << "int get seqid => _seqid;" << endl2;
    indent(f_service_) << "int nextSeqid() => ++_seqid;" << endl2;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    // Open function
    indent(f_service_) << function_signature(*f_iter) << " async";
    scope_up(f_service_);

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_args_class_name((*f_iter)->get_name());
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    indent(f_service_) << "oprot.writeMessageBegin(new TMessage(\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", nextSeqid()));" << endl;
    indent(f_service_) << argsname << " args = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      string arg_field_name = get_member_name((*fld_iter)->get_name());
      indent(f_service_) << "args." << arg_field_name << " = "
                 << arg_field_name << ";" << endl;
    }

    indent(f_service_) << "args.write(oprot);" << endl;
    indent(f_service_) << "oprot.writeMessageEnd();" << endl2;

    indent(f_service_) << "await oprot.transport.flush();" << endl2;

    if (!(*f_iter)->is_oneway()) {
      indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
      indent(f_service_) << "if (msg.type == TMessageType.EXCEPTION)";
      scope_up(f_service_);
      indent(f_service_) << "TApplicationError error = TApplicationError.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;
      indent(f_service_) << "throw error;" << endl;
      scope_down(f_service_, endl2);

      string result_class = get_result_class_name((*f_iter)->get_name());
      indent(f_service_) << result_class << " result = new " << result_class << "();" << endl;
      indent(f_service_) << "result.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (result." << generate_isset_check("success") << ")";
        scope_up(f_service_);
        indent(f_service_) << "return result.success;" << endl;
        scope_down(f_service_, endl2);
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        string result_field_name = get_member_name((*x_iter)->get_name());
        indent(f_service_) << "if (result." << result_field_name << " != null)";
        scope_up(f_service_);
        indent(f_service_) << "throw result." << result_field_name << ";" << endl;
        scope_down(f_service_);
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << "throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }
    }

    scope_down(f_service_, endl2);
  }

  scope_down(f_service_, endl2);
}